

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O0

void __thiscall FASTEXP_BigExp_Test::TestBody(FASTEXP_BigExp_Test *this)

{
  bool bVar1;
  ll lhs;
  char *message;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FASTEXP_BigExp_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  lhs = fastexp(0x97dbca6,0x2360c78abea6594,0x1f8dc715);
  testing::internal::EqHelper<false>::Compare
            ((EqHelper<false> *)local_20,"fastexp(159235238, 159328549238105492LL, 529385237)",
             "481182887LL",lhs,0x1cae44a7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(FASTEXP, BigExp) {
	EXPECT_EQ(fastexp(159235238, 159328549238105492LL, 529385237), 481182887LL);
}